

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O1

char * __thiscall
google::protobuf::internal::
MapEntryImpl<google::protobuf::Struct_FieldsEntry_DoNotUse,_google::protobuf::Message,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
::
Parser<google::protobuf::internal::MapFieldLite<google::protobuf::Struct_FieldsEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>_>
::_InternalParse(Parser<google::protobuf::internal::MapFieldLite<google::protobuf::Struct_FieldsEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>_>
                 *this,char *ptr,ParseContext *ctx)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  byte bVar1;
  bool bVar2;
  Value *msg;
  ulong extraout_RAX;
  int iVar3;
  uint size;
  char *pcVar4;
  int iVar5;
  pair<const_char_*,_int> pVar6;
  char *local_38;
  char *ptr_local;
  
  local_38 = ptr;
  bVar2 = EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,&local_38,ctx->group_depth_);
  if ((bVar2) || (*local_38 != '\n')) {
    if (local_38 == (char *)0x0) {
      return (char *)0x0;
    }
    MapEntryImpl<google::protobuf::Struct_FieldsEntry_DoNotUse,google::protobuf::Message,std::__cxx11::string,google::protobuf::Value,(google::protobuf::internal::WireFormatLite::FieldType)9,(google::protobuf::internal::WireFormatLite::FieldType)11,0>
    ::
    Parser<google::protobuf::internal::MapFieldLite<google::protobuf::Struct_FieldsEntry_DoNotUse,std::__cxx11::string,google::protobuf::Value,(google::protobuf::internal::WireFormatLite::FieldType)9,(google::protobuf::internal::WireFormatLite::FieldType)11,0>,google::protobuf::Map<std::__cxx11::string,google::protobuf::Value>>
    ::_InternalParse(this);
    goto LAB_002f4752;
  }
  bVar1 = local_38[1];
  size = (uint)bVar1;
  if ((char)bVar1 < '\0') {
    pVar6 = ReadSizeFallback(local_38 + 1,(uint)bVar1);
    size = pVar6.second;
    pcVar4 = pVar6.first;
  }
  else {
    pcVar4 = local_38 + 2;
  }
  s = &this->key_;
  if (pcVar4 == (char *)0x0) {
    local_38 = (char *)0x0;
  }
  else {
    local_38 = EpsCopyInputStream::ReadString(&ctx->super_EpsCopyInputStream,pcVar4,size,s);
  }
  if (local_38 == (char *)0x0) {
    return (char *)0x0;
  }
  bVar2 = WireFormatLite::VerifyUtf8String
                    ((this->key_)._M_dataplus._M_p,(int)(this->key_)._M_string_length,PARSE,
                     "google.protobuf.Struct.FieldsEntry.key");
  if (!bVar2) {
    return (char *)0x0;
  }
  bVar2 = EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,&local_38,ctx->group_depth_);
  if ((bVar2) || (*local_38 != '\x12')) {
    if (local_38 == (char *)0x0) {
      return (char *)0x0;
    }
LAB_002f473f:
    MapEntryImpl<google::protobuf::Struct_FieldsEntry_DoNotUse,google::protobuf::Message,std::__cxx11::string,google::protobuf::Value,(google::protobuf::internal::WireFormatLite::FieldType)9,(google::protobuf::internal::WireFormatLite::FieldType)11,0>
    ::
    Parser<google::protobuf::internal::MapFieldLite<google::protobuf::Struct_FieldsEntry_DoNotUse,std::__cxx11::string,google::protobuf::Value,(google::protobuf::internal::WireFormatLite::FieldType)9,(google::protobuf::internal::WireFormatLite::FieldType)11,0>,google::protobuf::Map<std::__cxx11::string,google::protobuf::Value>>
    ::_InternalParse(this);
  }
  else {
    pcVar4 = (char *)this->map_->elements_->num_elements_;
    msg = Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
          ::operator[](this->map_,s);
    this->value_ptr_ = msg;
    if (pcVar4 == (char *)this->map_->elements_->num_elements_) {
      iVar5 = 0;
    }
    else {
      local_38 = ParseContext::ParseMessage<google::protobuf::Value>(ctx,msg,local_38 + 1);
      if (local_38 == (char *)0x0) {
        iVar3 = 1;
LAB_002f47ba:
        Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
        ::erase(this->map_,s);
        iVar5 = iVar3;
      }
      else {
        bVar2 = EpsCopyInputStream::DoneWithCheck
                          (&ctx->super_EpsCopyInputStream,&local_38,ctx->group_depth_);
        iVar5 = 1;
        pcVar4 = local_38;
        if (bVar2) goto LAB_002f4722;
        MapEntryImpl<google::protobuf::Struct_FieldsEntry_DoNotUse,google::protobuf::Message,std::__cxx11::string,google::protobuf::Value,(google::protobuf::internal::WireFormatLite::FieldType)9,(google::protobuf::internal::WireFormatLite::FieldType)11,0>
        ::
        Parser<google::protobuf::internal::MapFieldLite<google::protobuf::Struct_FieldsEntry_DoNotUse,std::__cxx11::string,google::protobuf::Value,(google::protobuf::internal::WireFormatLite::FieldType)9,(google::protobuf::internal::WireFormatLite::FieldType)11,0>,google::protobuf::Map<std::__cxx11::string,google::protobuf::Value>>
        ::_InternalParse();
        iVar3 = 2;
        if ((extraout_RAX & 1) == 0) goto LAB_002f47ba;
      }
      pcVar4 = (char *)0x0;
    }
LAB_002f4722:
    if (iVar5 == 1) {
      return pcVar4;
    }
    if (iVar5 == 0) goto LAB_002f473f;
  }
  MapEntryImpl<google::protobuf::Struct_FieldsEntry_DoNotUse,google::protobuf::Message,std::__cxx11::string,google::protobuf::Value,(google::protobuf::internal::WireFormatLite::FieldType)9,(google::protobuf::internal::WireFormatLite::FieldType)11,0>
  ::
  Parser<google::protobuf::internal::MapFieldLite<google::protobuf::Struct_FieldsEntry_DoNotUse,std::__cxx11::string,google::protobuf::Value,(google::protobuf::internal::WireFormatLite::FieldType)9,(google::protobuf::internal::WireFormatLite::FieldType)11,0>,google::protobuf::Map<std::__cxx11::string,google::protobuf::Value>>
  ::_InternalParse();
LAB_002f4752:
  local_38 = MapEntryImpl<google::protobuf::Struct_FieldsEntry_DoNotUse,_google::protobuf::Message,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
             ::_InternalParse(this->entry_,local_38,ctx);
  if (local_38 != (char *)0x0) {
    UseKeyAndValueFromEntry(this);
  }
  return local_38;
}

Assistant:

const char* _InternalParse(const char* ptr, ParseContext* ctx) {
      if (PROTOBUF_PREDICT_TRUE(!ctx->Done(&ptr) && *ptr == kKeyTag)) {
        ptr = KeyTypeHandler::Read(ptr + 1, ctx, &key_);
        if (PROTOBUF_PREDICT_FALSE(!ptr || !Derived::ValidateKey(&key_))) {
          return nullptr;
        }
        if (PROTOBUF_PREDICT_TRUE(!ctx->Done(&ptr) && *ptr == kValueTag)) {
          typename Map::size_type map_size = map_->size();
          value_ptr_ = &(*map_)[key_];
          if (PROTOBUF_PREDICT_TRUE(map_size != map_->size())) {
            using T =
                typename MapIf<ValueTypeHandler::kIsEnum, int*, Value*>::type;
            ptr = ValueTypeHandler::Read(ptr + 1, ctx,
                                         reinterpret_cast<T>(value_ptr_));
            if (PROTOBUF_PREDICT_FALSE(!ptr ||
                                       !Derived::ValidateValue(value_ptr_))) {
              map_->erase(key_);  // Failure! Undo insertion.
              return nullptr;
            }
            if (PROTOBUF_PREDICT_TRUE(ctx->Done(&ptr))) return ptr;
            if (!ptr) return nullptr;
            NewEntry();
            ValueMover::Move(value_ptr_, entry_->mutable_value());
            map_->erase(key_);
            goto move_key;
          }
        } else {
          if (!ptr) return nullptr;
        }
        NewEntry();
      move_key:
        KeyMover::Move(&key_, entry_->mutable_key());
      } else {
        if (!ptr) return nullptr;
        NewEntry();
      }
      ptr = entry_->_InternalParse(ptr, ctx);
      if (ptr) UseKeyAndValueFromEntry();
      return ptr;
    }